

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O2

void rw::d3d9::defaultUninstanceCB(Geometry *geo,InstanceDataHeader *header)

{
  uint8 *puVar1;
  ulong uVar2;
  uint8 *verts [2];
  VertexElement dcl [12];
  uint8 *local_b8 [4];
  VertexElement local_98 [13];
  
  local_b8[0] = d3d::lockVertices(header->vertexStream[0].vertexBuffer,0,0,0);
  local_b8[3] = local_b8[0];
  local_b8[1] = d3d::lockVertices(header->vertexStream[1].vertexBuffer,0,0,0);
  local_b8[2] = local_b8[1];
  getDeclaration(header->vertexDeclaration,local_98);
  for (puVar1 = &local_98[0].usageIndex; (puVar1[-1] != '\0' || (*puVar1 != '\0'));
      puVar1 = puVar1 + 8) {
  }
  uninstV3d(*(int *)(d3d::vertFormatMap + (ulong)puVar1[-3] * 4),geo->morphTargets->vertices,
            local_b8[((VertexElement *)(puVar1 + -7))->stream] + *(ushort *)(puVar1 + -5),
            header->totalNumVertex,
            header->vertexStream[((VertexElement *)(puVar1 + -7))->stream].stride);
  if ((geo->flags & 8) != 0) {
    for (puVar1 = &local_98[0].usageIndex; (puVar1[-1] != '\n' || (*puVar1 != '\0'));
        puVar1 = puVar1 + 8) {
    }
    uninstColor(*(int *)(d3d::vertFormatMap + (ulong)puVar1[-3] * 4),geo->colors,
                local_b8[((VertexElement *)(puVar1 + -7))->stream] + *(ushort *)(puVar1 + -5),
                header->totalNumVertex,
                header->vertexStream[((VertexElement *)(puVar1 + -7))->stream].stride);
  }
  for (uVar2 = 0; puVar1 = &local_98[0].usageIndex, (long)uVar2 < (long)geo->numTexCoordSets;
      uVar2 = uVar2 + 1) {
    for (; (puVar1[-1] != 5 || (uVar2 != *puVar1)); puVar1 = puVar1 + 8) {
    }
    uninstTexCoords(*(int *)(d3d::vertFormatMap + (ulong)puVar1[-3] * 4),geo->texCoords[uVar2],
                    local_b8[((VertexElement *)(puVar1 + -7))->stream] + *(ushort *)(puVar1 + -5),
                    header->totalNumVertex,
                    header->vertexStream[((VertexElement *)(puVar1 + -7))->stream].stride);
  }
  if ((geo->flags & 0x10) != 0) {
    for (puVar1 = &local_98[0].usageIndex; (puVar1[-1] != '\x03' || (*puVar1 != '\0'));
        puVar1 = puVar1 + 8) {
    }
    uninstV3d(*(int *)(d3d::vertFormatMap + (ulong)puVar1[-3] * 4),geo->morphTargets->normals,
              local_b8[((VertexElement *)(puVar1 + -7))->stream] + *(ushort *)(puVar1 + -5),
              header->totalNumVertex,
              header->vertexStream[((VertexElement *)(puVar1 + -7))->stream].stride);
  }
  d3d::unlockVertices(local_b8[3]);
  d3d::unlockVertices(local_b8[2]);
  return;
}

Assistant:

void
defaultUninstanceCB(Geometry *geo, InstanceDataHeader *header)
{
	VertexElement dcl[NUMDECLELT];

	uint8 *verts[2];
	verts[0] = lockVertices(header->vertexStream[0].vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
	verts[1] = lockVertices(header->vertexStream[1].vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
	getDeclaration(header->vertexDeclaration, dcl);

	int i;
	for(i = 0; dcl[i].usage != D3DDECLUSAGE_POSITION || dcl[i].usageIndex != 0; i++)
		;
	uninstV3d(vertFormatMap[dcl[i].type],
		  geo->morphTargets[0].vertices,
	          verts[dcl[i].stream] + dcl[i].offset,
		  header->totalNumVertex,
		  header->vertexStream[dcl[i].stream].stride);

	if(geo->flags & Geometry::PRELIT){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_COLOR || dcl[i].usageIndex != 0; i++)
			;
		uninstColor(vertFormatMap[dcl[i].type],
			    geo->colors,
		            verts[dcl[i].stream] + dcl[i].offset,
			    header->totalNumVertex,
			    header->vertexStream[dcl[i].stream].stride);
	}

	for(int32 n = 0; n < geo->numTexCoordSets; n++){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_TEXCOORD || dcl[i].usageIndex != n; i++)
			;
		uninstTexCoords(vertFormatMap[dcl[i].type],
			  geo->texCoords[n],
		          verts[dcl[i].stream] + dcl[i].offset,
			  header->totalNumVertex,
			  header->vertexStream[dcl[i].stream].stride);
	}

	if(geo->flags & Geometry::NORMALS){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_NORMAL || dcl[i].usageIndex != 0; i++)
			;
		uninstV3d(vertFormatMap[dcl[i].type],
			  geo->morphTargets[0].normals,
		          verts[dcl[i].stream] + dcl[i].offset,
			  header->totalNumVertex,
			  header->vertexStream[dcl[i].stream].stride);
	}

	unlockVertices(verts[0]);
	unlockVertices(verts[1]);
}